

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O1

LONG PAL_wcstol(char16_t *nptr,char16_t **endptr,int base)

{
  long lVar1;
  int iVar2;
  DWORD DVar3;
  char *lpMultiByteStr;
  long lVar4;
  int *piVar5;
  LONG LVar6;
  char *local_38;
  char *s_endptr;
  
  local_38 = (char *)0x0;
  if (PAL_InitializeChakraCoreCalled) {
    iVar2 = WideCharToMultiByte(0,0,nptr,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
    if (iVar2 == 0) {
      DVar3 = GetLastError();
      lpMultiByteStr = (char *)0x0;
      fprintf(_stderr,"] %s %s:%d","PAL_wcstol",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/wchar.cpp"
              ,0x20b);
      fprintf(_stderr,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar3);
      SetLastError(0x57);
      LVar6 = 0;
    }
    else {
      lpMultiByteStr = (char *)PAL_malloc((long)iVar2);
      if (lpMultiByteStr == (char *)0x0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_001c9be6;
        SetLastError(8);
        lpMultiByteStr = (char *)0x0;
        LVar6 = 0;
      }
      else {
        iVar2 = WideCharToMultiByte(0,0,nptr,-1,lpMultiByteStr,iVar2,(LPCSTR)0x0,(LPBOOL)0x0);
        if (iVar2 == 0) {
          DVar3 = GetLastError();
          LVar6 = 0;
          fprintf(_stderr,"] %s %s:%d","PAL_wcstol",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/wchar.cpp"
                  ,0x21c);
          fprintf(_stderr,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar3);
          SetLastError(0x57);
        }
        else {
          lVar4 = strtol(lpMultiByteStr,&local_38,base);
          lVar1 = 0x7fffffff;
          if ((0x7fffffff < lVar4) || (lVar1 = -0x80000000, lVar4 < -0x80000000)) {
            lVar4 = lVar1;
            piVar5 = __errno_location();
            *piVar5 = 0x22;
          }
          LVar6 = (LONG)lVar4;
          if (endptr != (char16_t **)0x0) {
            *endptr = nptr + ((int)local_38 - (int)lpMultiByteStr);
          }
        }
      }
    }
    PAL_free(lpMultiByteStr);
    if (PAL_InitializeChakraCoreCalled != false) {
      return LVar6;
    }
  }
LAB_001c9be6:
  abort();
}

Assistant:

LONG
__cdecl
PAL_wcstol(
        const char16_t *nptr,
        char16_t **endptr,
        int base)
{
    char *s_nptr = 0;
    char *s_endptr = 0;
    long res;
    int size;
    DWORD dwLastError = 0;

    PERF_ENTRY(wcstol);
    ENTRY("wcstol (nptr=%p (%S), endptr=%p, base=%d)\n", nptr?nptr:W16_NULLSTRING, nptr?nptr:W16_NULLSTRING,
          endptr, base);

    size = WideCharToMultiByte(CP_ACP, 0, nptr, -1, NULL, 0, NULL, NULL);
    if (!size)
    {
        dwLastError = GetLastError();
        ASSERT("WideCharToMultiByte failed.  Error is %d\n", dwLastError);
        SetLastError(ERROR_INVALID_PARAMETER);
        res = 0;
        goto PAL_wcstolExit;
    }
    s_nptr = (char *)PAL_malloc(size);
    if (!s_nptr)
    {
        ERROR("PAL_malloc failed\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        res = 0;
        goto PAL_wcstolExit;
    }
    size = WideCharToMultiByte(CP_ACP, 0, nptr, -1, s_nptr, size, NULL, NULL);
    if( size==0 )
    {
        dwLastError = GetLastError();
        ASSERT("WideCharToMultiByte failed.  Error is %d\n", dwLastError);
        SetLastError(ERROR_INVALID_PARAMETER);
        res = 0;
        goto PAL_wcstolExit;
    }

    res = strtol(s_nptr, &s_endptr, base);

#ifdef BIT64
    if (res > _I32_MAX)
    {
        res = _I32_MAX;
        errno = ERANGE;
    }
    else if (res < _I32_MIN)
    {
        res = _I32_MIN;
        errno = ERANGE;
    }
#endif

    /* only ASCII characters will be accepted by strtol, and those always get
       mapped to single-byte characters, so the first rejected character will
       have the same index in the multibyte and widechar strings */
    if( endptr )
    {
        size = s_endptr - s_nptr;
        *endptr = (char16_t *)&nptr[size];
    }

PAL_wcstolExit:
    PAL_free(s_nptr);
    LOGEXIT("wcstol returning long %ld\n", res);
    PERF_EXIT(wcstol);
    /* This explicit cast to LONG is used to silence any potential warnings
    due to implicitly casting the native long res to LONG when returning. */
    return (LONG)res;
}